

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_MOVPRFX_m(DisasContext_conflict1 *s,arg_rpr_esz *a)

{
  undefined1 uVar1;
  undefined1 extraout_AL;
  uint32_t dofs;
  
  uVar1 = sve_access_check_aarch64(s);
  if ((bool)uVar1) {
    dofs = a->rd * 0x100 + 0xc10;
    tcg_gen_gvec_4_ool_aarch64
              (s->uc->tcg_ctx,dofs,a->rn * 0x100 + 0xc10,dofs,a->pg * 0x20 + 0x2c10,s->sve_len,
               s->sve_len,0,*(undefined1 **)(do_sel_z_fns + (long)a->esz * 8));
    uVar1 = extraout_AL;
  }
  return (_Bool)uVar1;
}

Assistant:

static bool trans_MOVPRFX_m(DisasContext *s, arg_rpr_esz *a)
{
    if (sve_access_check(s)) {
        do_sel_z(s, a->rd, a->rn, a->rd, a->pg, a->esz);
    }
    return true;
}